

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Gluco::OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::
clean(OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted> *this,
     Lit *idx)

{
  vec<Gluco::Solver::Watcher> *this_00;
  vec<Gluco::Solver::Watcher> *pvVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  pvVar1 = (this->occs).data;
  this_00 = pvVar1 + idx->x;
  if (pvVar1[idx->x].sz < 1) {
    iVar6 = 0;
  }
  else {
    lVar4 = 0;
    lVar5 = 0;
    iVar6 = 0;
    do {
      bVar2 = Solver::WatcherDeleted::operator()
                        (&this->deleted,(Watcher *)((long)&this_00->data->cref + lVar4));
      if (!bVar2) {
        lVar3 = (long)iVar6;
        iVar6 = iVar6 + 1;
        this_00->data[lVar3] = *(Watcher *)((long)&this_00->data->cref + lVar4);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 8;
    } while (lVar5 < this_00->sz);
    iVar6 = (int)lVar5 - iVar6;
  }
  vec<Gluco::Solver::Watcher>::shrink(this_00,iVar6);
  (this->dirty).data[idx->x] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}